

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::~App(App *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *unaff_retaddr;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&PTR__App_009bd288;
  std::shared_ptr<CLI::Config>::~shared_ptr((shared_ptr<CLI::Config> *)0x1a88fd);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)unaff_retaddr);
  ::std::__cxx11::string::~string(in_RDI);
  std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::~vector
            ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
             unaff_retaddr);
  std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::~set
            ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
             0x1a8941);
  std::set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>::~set
            ((set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_> *)0x1a8952);
  std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::~set
            ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
             0x1a8963);
  std::set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>::~set
            ((set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_> *)0x1a8974);
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector(unaff_retaddr);
  std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::~vector
            ((vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)unaff_retaddr);
  std::
  vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)unaff_retaddr);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&)>
               *)0x1a89b8);
  std::shared_ptr<CLI::FormatterBase>::~shared_ptr((shared_ptr<CLI::FormatterBase> *)0x1a89c9);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)0x1a89da);
  ::std::__cxx11::string::~string(in_RDI);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)0x1a89fc);
  ::std::__cxx11::string::~string(in_RDI);
  std::
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ::~vector((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             *)unaff_retaddr);
  OptionDefaults::~OptionDefaults((OptionDefaults *)0x1a8a2f);
  std::function<void_()>::~function((function<void_()> *)0x1a8a40);
  std::function<void_()>::~function((function<void_()> *)0x1a8a4e);
  std::function<void_(unsigned_long)>::~function((function<void_(unsigned_long)> *)0x1a8a5c);
  ::std::__cxx11::string::~string(in_RDI);
  ::std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

virtual ~App() = default;